

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k053260.c
# Opt level: O1

UINT8 device_start_k053260(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  undefined8 *puVar1;
  UINT8 UVar2;
  DEV_DATA DVar3;
  long lVar4;
  k053260_state *info;
  uint uVar5;
  
  DVar3.chipInf = calloc(1,0xe8);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    ((DEV_DATA *)((long)DVar3.chipInf + 200))->chipInf = (void *)0x0;
    *(undefined8 *)((long)DVar3.chipInf + 0xd0) = 0;
    lVar4 = 0x30;
    do {
      *(void **)((long)DVar3.chipInf + lVar4 + -8) = DVar3.chipInf;
      *(undefined8 *)((long)DVar3.chipInf + lVar4) = 0;
      ((undefined8 *)((long)DVar3.chipInf + lVar4))[1] = 0;
      puVar1 = (undefined8 *)((long)DVar3.chipInf + lVar4 + 0xd);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xd0);
    if ((cfg->srMode == '\x01') ||
       ((uVar5 = cfg->clock >> 6, cfg->srMode == '\x02' && (uVar5 < cfg->smplRate)))) {
      uVar5 = cfg->smplRate;
    }
    ((DEV_DATA *)((long)DVar3.chipInf + 0xd8))->chipInf =
         (void *)(CONCAT44(cfg->clock,uVar5 >> 1) / (ulong)uVar5);
    lVar4 = 0x4d;
    do {
      *(undefined1 *)((long)DVar3.chipInf + lVar4) = 0;
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xed);
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar5;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_k053260(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k053260_state *info;
	UINT32 rate;
	int i;

	info = (k053260_state *)calloc(1, sizeof(k053260_state));
	if (info == NULL)
		return 0xFF;

	info->rom = NULL;
	info->rom_size = 0x00;
	info->rom_mask = 0x00;

	for (i = 0; i < 4; i++)
		KDSC_voice_start(&info->voice[i], info);

	rate = cfg->clock / CLOCKS_PER_SAMPLE;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, rate, cfg->smplRate);

	RC_SET_RATIO(&info->cycleCntr, cfg->clock, rate);

	k053260_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, rate, &devDef);

	return 0x00;
}